

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_test.cpp
# Opt level: O0

void operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,double,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>>
               (rt_expr<viennamath::rt_expression_interface<double>_> *e,double *t,
               rt_constant<long,_viennamath::rt_expression_interface<double>_> *u,double t2,
               double u2)

{
  type local_140;
  type local_120;
  type local_100;
  type local_e0;
  type local_c0;
  type local_a0;
  type local_80;
  type local_50;
  double local_30;
  double u2_local;
  double t2_local;
  rt_constant<long,_viennamath::rt_expression_interface<double>_> *u_local;
  double *t_local;
  rt_expr<viennamath::rt_expression_interface<double>_> *e_local;
  
  local_30 = u2;
  u2_local = t2;
  t2_local = (double)u;
  u_local = (rt_constant<long,_viennamath::rt_expression_interface<double>_> *)t;
  t_local = (double *)e;
  viennamath::operator+(&local_50,t,u);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::operator=
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)t_local,&local_50);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_50);
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)t_local,u2_local + local_30);
  viennamath::operator+
            (&local_80,(rt_constant<long,_viennamath::rt_expression_interface<double>_> *)t2_local,
             (double *)u_local);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::operator=
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)t_local,&local_80);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_80);
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)t_local,local_30 + u2_local);
  viennamath::operator-
            (&local_a0,(double *)u_local,
             (rt_constant<long,_viennamath::rt_expression_interface<double>_> *)t2_local);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::operator=
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)t_local,&local_a0);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_a0);
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)t_local,u2_local - local_30);
  viennamath::operator-
            (&local_c0,(rt_constant<long,_viennamath::rt_expression_interface<double>_> *)t2_local,
             (double *)u_local);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::operator=
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)t_local,&local_c0);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_c0);
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)t_local,local_30 - u2_local);
  viennamath::operator*
            (&local_e0,(double *)u_local,
             (rt_constant<long,_viennamath::rt_expression_interface<double>_> *)t2_local);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::operator=
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)t_local,&local_e0);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_e0);
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)t_local,u2_local * local_30);
  viennamath::operator*
            (&local_100,(rt_constant<long,_viennamath::rt_expression_interface<double>_> *)t2_local,
             (double *)u_local);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::operator=
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)t_local,&local_100);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_100);
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)t_local,local_30 * u2_local);
  viennamath::operator/
            (&local_120,(double *)u_local,
             (rt_constant<long,_viennamath::rt_expression_interface<double>_> *)t2_local);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::operator=
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)t_local,&local_120);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_120);
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)t_local,u2_local / local_30);
  viennamath::operator/
            (&local_140,(rt_constant<long,_viennamath::rt_expression_interface<double>_> *)t2_local,
             (double *)u_local);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::operator=
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)t_local,&local_140);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_140);
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)t_local,local_30 / u2_local);
  return;
}

Assistant:

void operations_test(E & e, T const & t, U const & u, double t2, double u2)
{
  e = t + u; evaluations_test(e, t2 + u2);
  e = u + t; evaluations_test(e, u2 + t2);
  e = t - u; evaluations_test(e, t2 - u2);
  e = u - t; evaluations_test(e, u2 - t2);
  e = t * u; evaluations_test(e, t2 * u2);
  e = u * t; evaluations_test(e, u2 * t2);
  e = t / u; evaluations_test(e, t2 / u2);
  e = u / t; evaluations_test(e, u2 / t2);
}